

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

bool DoArbitrate(void *userdata)

{
  BYTE BVar1;
  undefined8 *puVar2;
  bool bVar3;
  SWORD SVar4;
  uint uVar5;
  BYTE *in_RAX;
  char *copyStr;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *local_38;
  
  local_38 = in_RAX;
  bVar3 = HGetPacket();
  if (bVar3) {
    do {
      uVar9 = (uint)doomcom.remotenode;
      if (uVar9 != 0) {
        if ((doomcom.data[0] & 0xfe) == 0x20) {
          if (doomcom.data[0] != ' ') {
            uVar9 = nodeforplayer[doomcom.data[1]];
          }
          lVar7 = (long)(int)uVar9;
          *(uint *)((long)userdata + lVar7 * 4) =
               (uint)doomcom.data._5_4_ >> 0x18 | (doomcom.data._5_4_ & 0xff0000) >> 8 |
               (doomcom.data._5_4_ & 0xff00) << 8 | doomcom.data._5_4_ << 0x18;
          local_38 = doomcom.data + 9;
          if (doomcom.data[0] == ' ') {
            *(byte *)((long)userdata + lVar7 + 0x20) = doomcom.data[9] & 0x80;
            local_38 = doomcom.data + 10;
          }
          D_ReadUserInfoStrings((uint)doomcom.data[1],&local_38,false);
          if (nodeingame[lVar7] == false) {
            if (((uint)doomcom.data[4] | (uint)doomcom.data[3] << 8 | (uint)doomcom.data[2] << 0x10)
                != 0xff00e8) {
              I_Error("Different GZDoom versions cannot play a net game");
            }
            BVar1 = doomcom.data[1];
            playeringame[doomcom.data[1]] = true;
            nodeingame[lVar7] = true;
            *(uint *)userdata = *userdata | 1 << (BVar1 & 0x1f);
            uVar5 = (uint)doomcom.data[1];
            puVar2 = (undefined8 *)
                     ((ulong)(((&DAT_00a602d8)[(ulong)uVar5 * 0xa8] - 1 & 0x1cf) * 0x18) +
                     (&DAT_00a602c8)[(ulong)uVar5 * 0x54]);
            do {
              puVar6 = puVar2;
              puVar2 = (undefined8 *)*puVar6;
            } while (*(int *)(puVar6 + 1) != 0x1cf);
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Found %s (node %d, player %d)",*(undefined8 *)(puVar6[2] + 0x28)
                       ,(ulong)uVar9,(ulong)(uVar5 + 1));
          }
        }
        else if (doomcom.data[0] == '\"') {
          *(undefined1 *)((long)userdata + 0x20) = 0x80;
          ticdup = (int)doomcom.data[1];
          doomcom.ticdup = (SWORD)doomcom.data[1];
          NetMode = doomcom.data[2];
          local_38 = doomcom.data + 3;
          copyStr = ReadString(&local_38);
          FString::operator=(&startmap,copyStr);
          if (copyStr != (char *)0x0) {
            operator_delete__(copyStr);
          }
          rngseed = ReadLong(&local_38);
          C_ReadCVars(&local_38);
        }
        else if (doomcom.data[0] == '#') {
          return true;
        }
      }
      bVar3 = HGetPacket();
    } while (bVar3);
  }
  if (consoleplayer == Net_Arbitrator) {
    uVar9 = (uint)doomcom.numnodes;
    if ((int)uVar9 < 1) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      while (((*(uint *)((long)userdata + uVar8 * 4) ^ -1 << ((byte)doomcom.numnodes & 0x1f)) ==
              0xffffffff && (*(char *)((long)userdata + uVar8 + 0x20) != '\0'))) {
        uVar8 = uVar8 + 1;
        if (uVar9 == uVar8) {
          return true;
        }
      }
    }
    if ((uint)uVar8 == uVar9) {
      return true;
    }
  }
  doomcom.data[2] = 0xff;
  doomcom.data[3] = '\0';
  doomcom.data[4] = 0xe8;
  doomcom.data[6] = *(BYTE *)((long)userdata + 2);
  doomcom.data[5] = *(BYTE *)((long)userdata + 3);
  doomcom.data[7] = *(BYTE *)((long)userdata + 1);
  doomcom.data[8] = *userdata;
  if (consoleplayer == Net_Arbitrator) {
    doomcom.data[0] = '!';
    if (1 < doomcom.numnodes) {
      lVar7 = 1;
      SVar4 = doomcom.numnodes;
      do {
        if (0 < SVar4) {
          uVar9 = 0;
          do {
            if (((*userdata >> (uVar9 & 0x1f) & 1) != 0) &&
               ((*(uint *)((long)userdata + lVar7 * 4) & 1 << ((byte)uVar9 & 0x1f)) == 0)) {
              local_38 = doomcom.data + 9;
              doomcom.data[1] = (byte)uVar9;
              D_WriteUserInfoStrings(uVar9,&local_38,true);
              HSendPacket((int)lVar7,(int)local_38 + -0xa51db4);
              SVar4 = doomcom.numnodes;
            }
            uVar9 = uVar9 + 1;
          } while ((int)uVar9 < (int)SVar4);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < SVar4);
    }
  }
  else {
    doomcom.data[0] = ' ';
    doomcom.data[1] = (BYTE)consoleplayer;
    doomcom.data[9] = *(BYTE *)((long)userdata + 0x20);
    local_38 = doomcom.data + 10;
    D_WriteUserInfoStrings(consoleplayer,&local_38,true);
    SendSetup((DWORD *)userdata,(BYTE *)((long)userdata + 0x20),(int)local_38 + -0xa51db4);
  }
  if (consoleplayer == Net_Arbitrator) {
    doomcom.data[0] = '\"';
    doomcom.data[1] = (BYTE)doomcom.ticdup;
    doomcom.data[2] = NetMode;
    local_38 = doomcom.data + 3;
    WriteString(startmap.Chars,&local_38);
    WriteLong(rngseed,&local_38);
    C_WriteCVars(&local_38,4,true);
    SendSetup((DWORD *)userdata,(BYTE *)((long)userdata + 0x20),(int)local_38 + -0xa51db4);
  }
  return false;
}

Assistant:

bool DoArbitrate (void *userdata)
{
	ArbitrateData *data = (ArbitrateData *)userdata;
	char *s;
	BYTE *stream;
	int version;
	int node;
	int i, j;

	while (HGetPacket ())
	{
		if (netbuffer[0] == NCMD_EXIT)
		{
			I_FatalError ("The game was aborted.");
		}

		if (doomcom.remotenode == 0)
		{
			continue;
		}

		if (netbuffer[0] == NCMD_SETUP || netbuffer[0] == NCMD_SETUP+1)		// got user info
		{
			node = (netbuffer[0] == NCMD_SETUP) ? doomcom.remotenode : nodeforplayer[netbuffer[1]];

			data->playersdetected[node] =
				(netbuffer[5] << 24) | (netbuffer[6] << 16) | (netbuffer[7] << 8) | netbuffer[8];

			if (netbuffer[0] == NCMD_SETUP)
			{ // Sent to host
				data->gotsetup[node] = netbuffer[9] & 0x80;
				stream = &netbuffer[10];
			}
			else
			{ // Sent from host
				stream = &netbuffer[9];
			}

			D_ReadUserInfoStrings (netbuffer[1], &stream, false);
			if (!nodeingame[node])
			{
				version = (netbuffer[2] << 16) | (netbuffer[3] << 8) | netbuffer[4];
				if (version != (0xFF0000 | NETGAMEVERSION))
				{
					I_Error ("Different " GAMENAME " versions cannot play a net game");
				}

				playeringame[netbuffer[1]] = true;
				nodeingame[node] = true;

				data->playersdetected[0] |= 1 << netbuffer[1];

				StartScreen->NetMessage ("Found %s (node %d, player %d)",
						players[netbuffer[1]].userinfo.GetName(),
						node, netbuffer[1]+1);
			}
		}
		else if (netbuffer[0] == NCMD_SETUP+2)	// got game info
		{
			data->gotsetup[0] = 0x80;

			ticdup = doomcom.ticdup = netbuffer[1];
			NetMode = netbuffer[2];

			stream = &netbuffer[3];
			s = ReadString (&stream);
			startmap = s;
			delete[] s;
			rngseed = ReadLong (&stream);
			C_ReadCVars (&stream);
		}
		else if (netbuffer[0] == NCMD_SETUP+3)
		{
			return true;
		}
	}

	// If everybody already knows everything, it's time to go
	if (consoleplayer == Net_Arbitrator)
	{
		for (i = 0; i < doomcom.numnodes; ++i)
			if (data->playersdetected[i] != DWORD(1 << doomcom.numnodes) - 1 || !data->gotsetup[i])
				break;

		if (i == doomcom.numnodes)
			return true;
	}

	netbuffer[2] = 255;
	netbuffer[3] = (NETGAMEVERSION >> 8) & 255;
	netbuffer[4] = NETGAMEVERSION & 255;
	netbuffer[5] = data->playersdetected[0] >> 24;
	netbuffer[6] = data->playersdetected[0] >> 16;
	netbuffer[7] = data->playersdetected[0] >> 8;
	netbuffer[8] = data->playersdetected[0];

	if (consoleplayer != Net_Arbitrator)
	{ // Send user info for the local node
		netbuffer[0] = NCMD_SETUP;
		netbuffer[1] = consoleplayer;
		netbuffer[9] = data->gotsetup[0];
		stream = &netbuffer[10];
		D_WriteUserInfoStrings (consoleplayer, &stream, true);
		SendSetup (data->playersdetected, data->gotsetup, int(stream - netbuffer));
	}
	else
	{ // Send user info for all nodes
		netbuffer[0] = NCMD_SETUP+1;
		for (i = 1; i < doomcom.numnodes; ++i)
		{
			for (j = 0; j < doomcom.numnodes; ++j)
			{
				// Send info about player j to player i?
				if ((data->playersdetected[0] & (1<<j)) && !(data->playersdetected[i] & (1<<j)))
				{
					netbuffer[1] = j;
					stream = &netbuffer[9];
					D_WriteUserInfoStrings (j, &stream, true);
					HSendPacket (i, int(stream - netbuffer));
				}
			}
		}
	}

	// If we're the host, send the game info, too
	if (consoleplayer == Net_Arbitrator)
	{
		netbuffer[0] = NCMD_SETUP+2;
		netbuffer[1] = (BYTE)doomcom.ticdup;
		netbuffer[2] = NetMode;
		stream = &netbuffer[3];
		WriteString (startmap, &stream);
		WriteLong (rngseed, &stream);
		C_WriteCVars (&stream, CVAR_SERVERINFO, true);

		SendSetup (data->playersdetected, data->gotsetup, int(stream - netbuffer));
	}
	return false;
}